

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O0

bool sznet::net::InetAddress::resolve(StringArg hostname,InetAddress *out)

{
  char *__name;
  LogStream *this;
  SourceFile file;
  undefined1 local_1010 [12];
  Logger local_1000;
  int local_2c;
  addrinfo *paStack_28;
  int ret;
  addrinfo *res;
  InetAddress *out_local;
  StringArg hostname_local;
  
  res = (addrinfo *)out;
  out_local = (InetAddress *)hostname.m_str;
  if (out != (InetAddress *)0x0) {
    paStack_28 = (addrinfo *)0x0;
    __name = StringArg::c_str((StringArg *)&out_local);
    local_2c = getaddrinfo(__name,(char *)0x0,(addrinfo *)0x0,&stack0xffffffffffffffd8);
    if ((local_2c == 0) && (paStack_28 != (addrinfo *)0x0)) {
      res->ai_family = *(int *)paStack_28->ai_addr;
      freeaddrinfo(paStack_28);
      hostname_local.m_str._7_1_ = true;
    }
    else {
      if (local_2c != 0) {
        Logger::SourceFile::SourceFile<102>
                  ((SourceFile *)local_1010,
                   (char (*) [102])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/InetAddress.cpp"
                  );
        file._12_4_ = 0;
        file.m_data = (char *)local_1010._0_8_;
        file.m_size = local_1010._8_4_;
        Logger::Logger(&local_1000,file,0x95,false);
        this = Logger::stream(&local_1000);
        LogStream::operator<<(this,"InetAddress::resolve");
        Logger::~Logger(&local_1000);
      }
      hostname_local.m_str._7_1_ = false;
    }
    return hostname_local.m_str._7_1_;
  }
  __assert_fail("out != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/InetAddress.cpp"
                ,0x88,"static bool sznet::net::InetAddress::resolve(StringArg, InetAddress *)");
}

Assistant:

bool InetAddress::resolve(StringArg hostname, InetAddress* out)
{
	assert(out != nullptr);
	struct addrinfo *res = nullptr;
	int ret = getaddrinfo(hostname.c_str(), nullptr, 0, &res);
	if (ret == 0 && res != nullptr)
	{
		out->m_addr.sin_addr = *reinterpret_cast<struct in_addr*>(res->ai_addr);
		freeaddrinfo(res);
		return true;
	}
	else
	{
		if (ret)
		{
			LOG_SYSERR << "InetAddress::resolve";
		}
		return false;
	}
}